

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O3

void Nf_ManPrepareGate(int nVars,word uTruth,int *pComp,int *pPerm,Vec_Wrd_t *vResult)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  word *pwVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  
  uVar4 = Extra_Factorial(nVars);
  uVar10 = 1 << ((byte)nVars & 0x1f);
  vResult->nSize = 0;
  if ((int)uVar10 < 2) {
    uVar10 = 1;
  }
  bVar3 = true;
  iVar8 = 0;
  uVar12 = 0;
  do {
    if (0 < (int)uVar4) {
      uVar9 = 0;
      uVar11 = uVar12 ^ uTruth;
      do {
        uVar6 = uVar11;
        if (nVars != 0x1f) {
          uVar14 = (ulong)(uint)vResult->nCap;
          uVar7 = 0;
          do {
            iVar13 = (int)uVar14;
            if (iVar8 == iVar13) {
              if (iVar13 < 0x10) {
                if (vResult->pArray == (word *)0x0) {
                  pwVar5 = (word *)malloc(0x80);
                }
                else {
                  pwVar5 = (word *)realloc(vResult->pArray,0x80);
                }
                vResult->pArray = pwVar5;
                if (pwVar5 == (word *)0x0) {
LAB_00409c79:
                  __assert_fail("p->pArray",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                                ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
                }
                vResult->nCap = 0x10;
                uVar14 = 0x10;
              }
              else {
                uVar14 = (ulong)(uint)(iVar13 * 2);
                if (vResult->pArray == (word *)0x0) {
                  pwVar5 = (word *)malloc(uVar14 * 8);
                }
                else {
                  pwVar5 = (word *)realloc(vResult->pArray,uVar14 * 8);
                }
                vResult->pArray = pwVar5;
                if (pwVar5 == (word *)0x0) goto LAB_00409c79;
                vResult->nCap = iVar13 * 2;
              }
            }
            else {
              pwVar5 = vResult->pArray;
            }
            iVar13 = vResult->nSize;
            iVar8 = iVar13 + 1;
            vResult->nSize = iVar8;
            pwVar5[iVar13] = uVar6;
            bVar1 = (byte)(1L << ((byte)pComp[uVar7] & 0x3f));
            uVar6 = (s_Truths6[pComp[uVar7]] & uVar6) >> (bVar1 & 0x3f) |
                    uVar6 << (bVar1 & 0x3f) & s_Truths6[pComp[uVar7]];
            uVar7 = uVar7 + 1;
          } while (uVar10 != uVar7);
        }
        if (uVar11 != uVar6) {
          __assert_fail("tTemp2 == tCur",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioUtils.c"
                        ,0x54b,"void Nf_ManPrepareGate(int, word, int *, int *, Vec_Wrd_t *)");
        }
        iVar13 = pPerm[uVar9];
        bVar1 = (byte)(1L << ((byte)iVar13 & 0x3f));
        uVar11 = (uVar11 & s_PMasks[iVar13][2]) >> (bVar1 & 0x3f) |
                 (s_PMasks[iVar13][1] & uVar11) << (bVar1 & 0x3f) | s_PMasks[iVar13][0] & uVar11;
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar4);
      if ((uVar12 ^ uTruth) != uVar11) {
        __assert_fail("tTemp1 == tCur",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioUtils.c"
                      ,0x54e,"void Nf_ManPrepareGate(int, word, int *, int *, Vec_Wrd_t *)");
      }
    }
    uVar12 = 0xffffffffffffffff;
    bVar2 = !bVar3;
    bVar3 = false;
    if (bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void Nf_ManPrepareGate( int nVars, word uTruth, int * pComp, int * pPerm, Vec_Wrd_t * vResult )
{
    int nPerms = Extra_Factorial( nVars );
    int nMints = (1 << nVars);
    word tCur, tTemp1, tTemp2;
    int i, p, c;
    Vec_WrdClear( vResult );
    for ( i = 0; i < 2; i++ )
    {
        tCur = i ? ~uTruth : uTruth;
        tTemp1 = tCur;
        for ( p = 0; p < nPerms; p++ )
        {
            tTemp2 = tCur;
            for ( c = 0; c < nMints; c++ )
            {
                Vec_WrdPush( vResult, tCur );
                tCur = Abc_Tt6Flip( tCur, pComp[c] );
            }
            assert( tTemp2 == tCur );
            tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[p] );
        }
        assert( tTemp1 == tCur );
    }
}